

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commodities.cpp
# Opt level: O1

string * __thiscall
units::getCommodityName_abi_cxx11_(string *__return_storage_ptr__,units *this,uint32_t commodity)

{
  long *plVar1;
  char cVar2;
  long lVar3;
  undefined8 *puVar4;
  long *plVar5;
  __hash_code __code;
  size_type *psVar6;
  uint uVar7;
  ulong uVar8;
  uint __val;
  ulong uVar9;
  char cVar10;
  long *plVar11;
  string __str;
  long *local_88;
  undefined8 local_80;
  long local_78;
  undefined8 uStack_70;
  ulong *local_68;
  uint local_60;
  undefined4 uStack_5c;
  ulong local_58 [2];
  ulong *local_48;
  long local_40;
  ulong local_38 [2];
  
  __val = (uint)this;
  uVar9 = (ulong)this & 0xffffffff;
  if (((_ZN5unitsL22allowCustomCommoditiesE_0 & 1) != 0) && (_DAT_001afdc0 != 0)) {
    uVar8 = ((ulong)this & 0xffffffff) % _DAT_001afdb0;
    plVar5 = *(long **)(customCommodityNames_abi_cxx11_ + uVar8 * 8);
    plVar11 = (long *)0x0;
    if ((plVar5 != (long *)0x0) &&
       (plVar1 = (long *)*plVar5, plVar11 = plVar5, *(uint *)((long *)*plVar5 + 1) != __val)) {
      while (plVar5 = plVar1, plVar1 = (long *)*plVar5, plVar1 != (long *)0x0) {
        plVar11 = (long *)0x0;
        if (((ulong)*(uint *)(plVar1 + 1) % _DAT_001afdb0 != uVar8) ||
           (plVar11 = plVar5, *(uint *)(plVar1 + 1) == __val)) goto LAB_00171d35;
      }
      plVar11 = (long *)0x0;
    }
LAB_00171d35:
    if (plVar11 == (long *)0x0) {
      lVar3 = 0;
    }
    else {
      lVar3 = *plVar11;
    }
    if (lVar3 != 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,*(long *)(lVar3 + 0x10),
                 *(long *)(lVar3 + 0x18) + *(long *)(lVar3 + 0x10));
      return __return_storage_ptr__;
    }
  }
  uVar8 = ((ulong)this & 0xffffffff) % DAT_001afd40;
  plVar5 = *(long **)(commodities::commodity_names + uVar8 * 8);
  plVar11 = (long *)0x0;
  if ((plVar5 != (long *)0x0) &&
     (plVar1 = (long *)*plVar5, plVar11 = plVar5, *(uint *)((long *)*plVar5 + 1) != __val)) {
    while (plVar5 = plVar1, plVar1 = (long *)*plVar5, plVar1 != (long *)0x0) {
      plVar11 = (long *)0x0;
      if (((ulong)*(uint *)(plVar1 + 1) % DAT_001afd40 != uVar8) ||
         (plVar11 = plVar5, *(uint *)(plVar1 + 1) == __val)) goto LAB_00171dc1;
    }
    plVar11 = (long *)0x0;
  }
LAB_00171dc1:
  if (plVar11 == (long *)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = *plVar11;
  }
  if (lVar3 != 0) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,*(char **)(lVar3 + 0x10),(allocator *)&local_88);
    return __return_storage_ptr__;
  }
  if ((__val & 0x7c000000) == 0x40000000) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    cVar10 = (char)__return_storage_ptr__;
    std::__cxx11::string::push_back(cVar10);
    std::__cxx11::string::push_back(cVar10);
    std::__cxx11::string::push_back(cVar10);
    std::__cxx11::string::push_back(cVar10);
    std::__cxx11::string::push_back(cVar10);
    while( true ) {
      if (__return_storage_ptr__->_M_string_length == 0) {
        return __return_storage_ptr__;
      }
      if ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1]
          != '_') break;
      std::__cxx11::string::pop_back();
    }
    return __return_storage_ptr__;
  }
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"CXCOMM[","");
  cVar10 = '\x01';
  if (9 < __val) {
    cVar2 = '\x04';
    do {
      cVar10 = cVar2;
      uVar7 = (uint)uVar9;
      if (uVar7 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_00171f0e;
      }
      if (uVar7 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_00171f0e;
      }
      if (uVar7 < 10000) goto LAB_00171f0e;
      uVar9 = uVar9 / 10000;
      cVar2 = cVar10 + '\x04';
    } while (99999 < uVar7);
    cVar10 = cVar10 + '\x01';
  }
LAB_00171f0e:
  local_68 = local_58;
  std::__cxx11::string::_M_construct((ulong)&local_68,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_68,local_60,__val);
  uVar9 = CONCAT44(uStack_5c,local_60) + local_40;
  uVar8 = 0xf;
  if (local_48 != local_38) {
    uVar8 = local_38[0];
  }
  if (uVar8 < uVar9) {
    uVar8 = 0xf;
    if (local_68 != local_58) {
      uVar8 = local_58[0];
    }
    if (uVar9 <= uVar8) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_48);
      goto LAB_00171f92;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_48,(ulong)local_68);
LAB_00171f92:
  local_88 = &local_78;
  plVar5 = puVar4 + 2;
  if ((long *)*puVar4 == plVar5) {
    local_78 = *plVar5;
    uStack_70 = puVar4[3];
  }
  else {
    local_78 = *plVar5;
    local_88 = (long *)*puVar4;
  }
  local_80 = puVar4[1];
  *puVar4 = plVar5;
  puVar4[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_88);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar6) {
    lVar3 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getCommodityName(std::uint32_t commodity)
{
    if (allowCustomCommodities.load(std::memory_order_acquire)) {
        if (!customCommodityNames.empty()) {
            auto fnd2 = customCommodityNames.find(commodity);
            if (fnd2 != customCommodityNames.end()) {
                return fnd2->second;
            }
        }
    }
    auto fnd = commodities::commodity_names.find(commodity);
    if (fnd != commodities::commodity_names.end()) {
        return fnd->second;
    }

    if ((commodity & 0x7C000000U) == 0x40000000U) {
        std::string ret;
        ret.push_back((commodity & 0X1FU) + '_');
        ret.push_back(((commodity >> 5U) & 0X1FU) + '_');
        ret.push_back(((commodity >> 10U) & 0X1FU) + '_');
        ret.push_back(((commodity >> 15U) & 0X1FU) + '_');
        ret.push_back(((commodity >> 20U) & 0X1FU) + '_');
        while (!ret.empty() && ret.back() == '_') {
            ret.pop_back();
        }
        return ret;
    }
    return std::string("CXCOMM[") + std::to_string(commodity) + "]";
}